

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

void ts_lexer__advance(TSLexer *payload,_Bool skip)

{
  int iVar1;
  long lVar2;
  _func_void_TSLexer_ptr *p_Var3;
  undefined8 uVar4;
  int iVar5;
  char *pcVar6;
  
  if (payload[2].get_column == (_func_uint32_t_TSLexer_ptr *)"") {
    return;
  }
  iVar5 = payload[1].lookahead;
  iVar1 = payload[3].lookahead;
  if (iVar1 != 0) {
    iVar5 = iVar5 + iVar1;
    payload[1].lookahead = iVar5;
    if (payload->lookahead == 10) {
      *(int *)&payload[1].result_symbol = *(int *)&payload[1].result_symbol + 1;
      *(undefined4 *)&payload[1].advance = 0;
    }
    else {
      *(int *)&payload[1].advance = *(int *)&payload[1].advance + iVar1;
    }
  }
  lVar2 = *(long *)(payload + 2);
  p_Var3 = payload[2].mark_end;
  if (iVar5 == *(int *)(lVar2 + 0x14 + (long)p_Var3 * 0x18)) {
    payload[2].mark_end = p_Var3 + 1;
    if ((_func_void_TSLexer_ptr__Bool *)(p_Var3 + 1) == payload[2].advance) {
      payload->lookahead = 0;
      payload[3].lookahead = 1;
      return;
    }
    lVar2 = lVar2 + (long)p_Var3 * 0x18;
    uVar4 = *(undefined8 *)(lVar2 + 0x18);
    payload[1].lookahead = *(int32_t *)(lVar2 + 0x28);
    *(undefined8 *)&payload[1].result_symbol = uVar4;
  }
  lVar2._0_4_ = payload[4].lookahead;
  lVar2._4_2_ = payload[4].result_symbol;
  lVar2._6_2_ = *(undefined2 *)&payload[4].field_0x6;
  if (skip) {
    if (lVar2 != 0) {
      pcVar6 = "skip character:%d";
      if (payload->lookahead - 0x20U < 0x5f) {
        pcVar6 = "skip character:\'%c\'";
      }
      snprintf((char *)&payload[4].advance,0x400,pcVar6);
      (**(code **)(payload + 4))(payload[3].is_at_included_range_start,1,&payload[4].advance);
    }
    *(undefined4 *)((long)&payload[1].mark_end + 4) = *(undefined4 *)&payload[1].advance;
    *(undefined8 *)((long)&payload[1].advance + 4) = *(undefined8 *)(payload + 1);
  }
  else if (lVar2 != 0) {
    pcVar6 = "consume character:%d";
    if (payload->lookahead - 0x20U < 0x5f) {
      pcVar6 = "consume character:\'%c\'";
    }
    snprintf((char *)&payload[4].advance,0x400,pcVar6);
    (**(code **)(payload + 4))(payload[3].is_at_included_range_start,1,&payload[4].advance);
  }
  if ((uint)(*(int *)((long)&payload[2].is_at_included_range_start + 4) +
            *(int *)&payload[2].is_at_included_range_start) <= (uint)payload[1].lookahead) {
    *(int32_t *)&payload[2].is_at_included_range_start = payload[1].lookahead;
    pcVar6 = (char *)(*payload[3].mark_end)((TSLexer *)payload[3].advance);
    if (*(int *)((long)&payload[2].is_at_included_range_start + 4) == 0) {
      pcVar6 = "";
    }
    payload[2].get_column = (_func_uint32_t_TSLexer_ptr *)pcVar6;
  }
  ts_lexer__get_lookahead((Lexer *)payload);
  return;
}

Assistant:

static void ts_lexer__advance(TSLexer *payload, bool skip) {
  Lexer *self = (Lexer *)payload;
  if (self->chunk == empty_chunk)
    return;

  if (self->lookahead_size) {
    self->current_position.bytes += self->lookahead_size;
    if (self->data.lookahead == '\n') {
      self->current_position.extent.row++;
      self->current_position.extent.column = 0;
    } else {
      self->current_position.extent.column += self->lookahead_size;
    }
  }

  TSRange *current_range = &self->included_ranges[self->current_included_range_index];
  if (self->current_position.bytes == current_range->end_byte) {
    self->current_included_range_index++;
    if (self->current_included_range_index == self->included_range_count) {
      self->data.lookahead = '\0';
      self->lookahead_size = 1;
      return;
    } else {
      current_range++;
      self->current_position = (Length) {
        current_range->start_byte,
        current_range->start_point,
      };
    }
  }

  if (skip) {
    LOG_CHARACTER("skip", self->data.lookahead);
    self->token_start_position = self->current_position;
  } else {
    LOG_CHARACTER("consume", self->data.lookahead);
  }

  if (self->current_position.bytes >= self->chunk_start + self->chunk_size) {
    ts_lexer__get_chunk(self);
  }

  ts_lexer__get_lookahead(self);
}